

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# person_builder.hpp
# Opt level: O0

void __thiscall PersonBuilder::PersonBuilder(PersonBuilder *this)

{
  Person *pPVar1;
  Person local_b8;
  PersonBuilder *local_10;
  PersonBuilder *this_local;
  
  local_10 = this;
  memset(&local_b8,0,0xa8);
  Person::Person(&local_b8);
  std::optional<Person>::optional<Person,_true>(&this->person,&local_b8);
  Person::~Person(&local_b8);
  pPVar1 = std::optional<Person>::operator*(&this->person);
  this->person_reference = pPVar1;
  return;
}

Assistant:

PersonBuilder()
		:	person{Person()},
			person_reference{*person}
	{}